

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O0

void ImGui::SetColumnOffset(int column_index,float offset)

{
  ImGuiOldColumns *columns_00;
  bool bVar1;
  ImGuiContext *pIVar2;
  ImGuiOldColumnData *pIVar3;
  float fVar4;
  float local_38;
  float width;
  bool preserve_width;
  ImGuiOldColumns *columns;
  ImGuiWindow *window;
  ImGuiContext *g;
  float offset_local;
  int column_index_local;
  
  pIVar2 = GImGui;
  columns_00 = (GImGui->CurrentWindow->DC).CurrentColumns;
  if (columns_00 == (ImGuiOldColumns *)0x0) {
    __assert_fail("columns != __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/imgui-src/imgui_tables.cpp"
                  ,0xe9e,"void ImGui::SetColumnOffset(int, float)");
  }
  g._4_4_ = column_index;
  if (column_index < 0) {
    g._4_4_ = columns_00->Current;
  }
  if (g._4_4_ < (columns_00->Columns).Size) {
    bVar1 = false;
    if ((columns_00->Flags & 4U) == 0) {
      bVar1 = g._4_4_ < columns_00->Count + -1;
    }
    if (bVar1) {
      local_38 = GetColumnWidthEx(columns_00,g._4_4_,(bool)(columns_00->IsBeingResized & 1));
    }
    else {
      local_38 = 0.0;
    }
    g._0_4_ = offset;
    if ((columns_00->Flags & 8U) == 0) {
      g._0_4_ = ImMin<float>(offset,-(pIVar2->Style).ColumnsMinSpacing *
                                    (float)(columns_00->Count - g._4_4_) + columns_00->OffMaxX);
    }
    fVar4 = GetColumnNormFromOffset(columns_00,g._0_4_ - columns_00->OffMinX);
    pIVar3 = ImVector<ImGuiOldColumnData>::operator[](&columns_00->Columns,g._4_4_);
    pIVar3->OffsetNorm = fVar4;
    if (bVar1) {
      fVar4 = ImMax<float>((pIVar2->Style).ColumnsMinSpacing,local_38);
      SetColumnOffset(g._4_4_ + 1,g._0_4_ + fVar4);
    }
    return;
  }
  __assert_fail("column_index < columns->Columns.Size",
                "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/imgui-src/imgui_tables.cpp"
                ,0xea2,"void ImGui::SetColumnOffset(int, float)");
}

Assistant:

void ImGui::SetColumnOffset(int column_index, float offset)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    ImGuiOldColumns* columns = window->DC.CurrentColumns;
    IM_ASSERT(columns != NULL);

    if (column_index < 0)
        column_index = columns->Current;
    IM_ASSERT(column_index < columns->Columns.Size);

    const bool preserve_width = !(columns->Flags & ImGuiOldColumnFlags_NoPreserveWidths) && (column_index < columns->Count - 1);
    const float width = preserve_width ? GetColumnWidthEx(columns, column_index, columns->IsBeingResized) : 0.0f;

    if (!(columns->Flags & ImGuiOldColumnFlags_NoForceWithinWindow))
        offset = ImMin(offset, columns->OffMaxX - g.Style.ColumnsMinSpacing * (columns->Count - column_index));
    columns->Columns[column_index].OffsetNorm = GetColumnNormFromOffset(columns, offset - columns->OffMinX);

    if (preserve_width)
        SetColumnOffset(column_index + 1, offset + ImMax(g.Style.ColumnsMinSpacing, width));
}